

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

void snga_compare_elem(Integer type,char *op,elem_info_t *new_info,elem_info_t *old_info,
                      Integer *update)

{
  int iVar1;
  double *in_RCX;
  double *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  
  *in_R8 = 0;
  switch(in_RDI) {
  case 0x3e9:
    iVar1 = strncmp(in_RSI,"min",3);
    if (iVar1 == 0) {
      if ((int)*(float *)in_RDX < (int)*(float *)in_RCX) {
        *(float *)in_RCX = *(float *)in_RDX;
        *in_R8 = 1;
      }
    }
    else if ((int)*(float *)in_RCX < (int)*(float *)in_RDX) {
      *(float *)in_RCX = *(float *)in_RDX;
      *in_R8 = 1;
    }
    break;
  case 0x3ea:
    iVar1 = strncmp(in_RSI,"min",3);
    if (iVar1 == 0) {
      if ((long)*in_RDX < (long)*in_RCX) {
        *in_RCX = *in_RDX;
        *in_R8 = 1;
      }
    }
    else if ((long)*in_RCX < (long)*in_RDX) {
      *in_RCX = *in_RDX;
      *in_R8 = 1;
    }
    break;
  case 0x3eb:
    iVar1 = strncmp(in_RSI,"min",3);
    if (iVar1 == 0) {
      if (*(float *)in_RDX < *(float *)in_RCX) {
        *(float *)in_RCX = *(float *)in_RDX;
        *in_R8 = 1;
      }
    }
    else if (*(float *)in_RCX <= *(float *)in_RDX && *(float *)in_RDX != *(float *)in_RCX) {
      *(float *)in_RCX = *(float *)in_RDX;
      *in_R8 = 1;
    }
    break;
  case 0x3ec:
    iVar1 = strncmp(in_RSI,"min",3);
    if (iVar1 == 0) {
      if (*in_RDX < *in_RCX) {
        *in_RCX = *in_RDX;
        *in_R8 = 1;
      }
    }
    else if (*in_RCX <= *in_RDX && *in_RDX != *in_RCX) {
      *in_RCX = *in_RDX;
      *in_R8 = 1;
    }
    break;
  case 0x3ee:
    iVar1 = strncmp(in_RSI,"min",3);
    if (iVar1 == 0) {
      if (*(float *)in_RDX < *(float *)in_RCX) {
        *(float *)in_RCX = *(float *)in_RDX;
        in_RCX[10] = in_RDX[10];
        *in_R8 = 1;
      }
    }
    else if (*(float *)in_RCX <= *(float *)in_RDX && *(float *)in_RDX != *(float *)in_RCX) {
      *(float *)in_RCX = *(float *)in_RDX;
      in_RCX[10] = in_RDX[10];
      *in_R8 = 1;
    }
    break;
  case 0x3ef:
    iVar1 = strncmp(in_RSI,"min",3);
    if (iVar1 == 0) {
      if (*in_RDX < *in_RCX) {
        *in_RCX = *in_RDX;
        in_RCX[8] = in_RDX[8];
        in_RCX[9] = in_RDX[9];
        *in_R8 = 1;
      }
    }
    else if (*in_RCX <= *in_RDX && *in_RDX != *in_RCX) {
      *in_RCX = *in_RDX;
      in_RCX[8] = in_RDX[8];
      in_RCX[9] = in_RDX[9];
      *in_R8 = 1;
    }
    break;
  case 0x3f8:
    iVar1 = strncmp(in_RSI,"min",3);
    if (iVar1 == 0) {
      if ((long)*in_RDX < (long)*in_RCX) {
        *in_RCX = *in_RDX;
        *in_R8 = 1;
      }
    }
    else if ((long)*in_RCX < (long)*in_RDX) {
      *in_RCX = *in_RDX;
      *in_R8 = 1;
    }
  }
  return;
}

Assistant:

static void snga_compare_elem(Integer type, char* op, elem_info_t *new_info,
    elem_info_t *old_info, Integer *update)
{
  *update = 0;
  switch (type) {
    case C_INT:
    if (strncmp(op,"min",3) == 0) {
      if  (new_info->v.ival < old_info->v.ival) {
        old_info->v.ival = new_info->v.ival;
        *update = 1;
      }
    } else {
      if  (new_info->v.ival > old_info->v.ival) {
        old_info->v.ival = new_info->v.ival;
        *update = 1;
      }
    }
    break;  

    case C_LONG:
    if (strncmp(op,"min",3) == 0) {
      if  (new_info->v.lval < old_info->v.lval) {
        old_info->v.lval = new_info->v.lval;
        *update = 1;
      }
    } else {
      if  (new_info->v.lval > old_info->v.lval) {
        old_info->v.lval = new_info->v.lval;
        *update = 1;
      }
    }
    break;  

    case C_LONGLONG:
    if (strncmp(op,"min",3) == 0) {
      if  (new_info->v.llval < old_info->v.llval) {
        old_info->v.llval = new_info->v.llval;
        *update = 1;
      }
    } else {
      if  (new_info->v.llval > old_info->v.llval) {
        old_info->v.llval = new_info->v.llval;
        *update = 1;
      }
    }
    break;  

    case C_DBL:
    if (strncmp(op,"min",3) == 0) {
      if  (new_info->v.dval < old_info->v.dval) {
        old_info->v.dval = new_info->v.dval;
        *update = 1;
      }
    } else {
      if  (new_info->v.dval > old_info->v.dval) {
        old_info->v.dval = new_info->v.dval;
        *update = 1;
      }
    }
    break;  

    case C_FLOAT:
    if (strncmp(op,"min",3) == 0) {
      if  (new_info->v.fval < old_info->v.fval) {
        old_info->v.fval = new_info->v.fval;
        *update = 1;
      }
    } else {
      if  (new_info->v.fval > old_info->v.fval) {
        old_info->v.fval = new_info->v.fval;
        *update = 1;
      }
    }
    break;  

    case C_SCPL:
    if (strncmp(op,"min",3) == 0) {
      if  (new_info->v.fval < old_info->v.fval) {
        old_info->v.fval = new_info->v.fval;
        old_info->extra2 = new_info->extra2;
        *update = 1;
      }
    } else {
      if  (new_info->v.fval > old_info->v.fval) {
        old_info->v.fval = new_info->v.fval;
        old_info->extra2 = new_info->extra2;
        *update = 1;
      }
    }
    break;  

    case C_DCPL:
    if (strncmp(op,"min",3) == 0) {
      if  (new_info->v.dval < old_info->v.dval) {
        old_info->v.dval = new_info->v.dval;
        old_info->extra = new_info->extra;
        *update = 1;
      }
    } else {
      if  (new_info->v.dval > old_info->v.dval) {
        old_info->v.dval = new_info->v.dval;
        old_info->extra = new_info->extra;
        *update = 1;
      }
    }
    break;  
  }
}